

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void pbrt::Bump<pbrt::UniversalTextureEvaluator>
               (ulong *param_1,Image *param_2,BumpEvalContext *param_3,Vector3<float> *param_4,
               undefined8 *param_5)

{
  Vector3f *pVVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  Tuple2<pbrt::Point2,_float> TVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar39 [56];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined4 extraout_XMM0_Db;
  undefined8 uVar38;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  Vector3<float> VVar47;
  Point3<float> PVar48;
  Vector3f VVar49;
  UniversalTextureEvaluator local_149;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  Float local_130;
  Float local_12c;
  float local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  Tuple3<pbrt::Vector3,_float> local_118;
  float local_108;
  Tuple3<pbrt::Vector3,_float> *local_f8;
  Vector3<float> *local_f0;
  undefined8 *local_e8;
  Tuple3<pbrt::Vector3,_float> local_e0;
  WrapMode2D wrap;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  Frame frame;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  int iStack_74;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined1 auVar34 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  if ((*param_1 & 0xffffffffffff) == 0) {
    WrapMode2D::WrapMode2D(&wrap,Repeat);
    auVar22._0_8_ = param_3->uv;
    auVar22._8_4_ = (param_3->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    auVar22._12_4_ = (param_3->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    _local_148 = vinsertps_avx(auVar22,ZEXT416((uint)(1.0 - (param_3->uv).
                                                            super_Tuple2<pbrt::Point2,_float>.y)),
                               0x10);
    local_128 = Image::BilerpChannel(param_2,(Point2f)local_148,0,wrap);
    uStack_124 = extraout_XMM0_Db;
    uStack_120 = extraout_XMM0_Dc;
    uStack_11c = extraout_XMM0_Dd;
    local_108 = Image::BilerpChannel(param_2,(Point2f)local_148,1,wrap);
    auVar32._0_4_ = Image::BilerpChannel(param_2,(Point2f)local_148,2,wrap);
    auVar32._4_60_ = extraout_var;
    auVar44._8_4_ = 0x40000000;
    auVar44._0_8_ = 0x4000000040000000;
    auVar44._12_4_ = 0x40000000;
    auVar27 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar32._0_16_,ZEXT416(0xbf800000));
    auVar20._4_4_ = uStack_124;
    auVar20._0_4_ = local_128;
    auVar20._8_4_ = uStack_120;
    auVar20._12_4_ = uStack_11c;
    auVar22 = vinsertps_avx(auVar20,ZEXT416((uint)local_108),0x10);
    auVar39 = ZEXT856(auVar22._8_8_);
    auVar18._8_4_ = 0xbf800000;
    auVar18._0_8_ = 0xbf800000bf800000;
    auVar18._12_4_ = 0xbf800000;
    auVar22 = vfmadd213ps_avx512vl(auVar44,auVar22,auVar18);
    local_118._0_8_ = vmovlps_avx(auVar22);
    local_118.z = auVar27._0_4_;
    VVar47 = Normalize<float>((Vector3<float> *)&local_118);
    local_118.z = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar33._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar33._8_56_ = auVar39;
    local_118._0_8_ = vmovlps_avx(auVar33._0_16_);
    Frame::FromZ(&frame,(Vector3f)(param_3->shading).n.super_Tuple3<pbrt::Normal3,_float>);
    VVar49.super_Tuple3<pbrt::Vector3,_float>.z = local_118.z;
    VVar49.super_Tuple3<pbrt::Vector3,_float>.x = local_118.x;
    VVar49.super_Tuple3<pbrt::Vector3,_float>.y = local_118.y;
    auVar39 = ZEXT856(0);
    VVar49 = Frame::FromLocal(&frame,VVar49);
    local_118.z = VVar49.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar34._0_8_ = VVar49.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar34._8_56_ = auVar39;
    pVVar1 = &(param_3->shading).dpdu;
    local_118._0_8_ = vmovlps_avx(auVar34._0_16_);
    local_128 = Length<float>(pVVar1);
    auVar35._0_4_ = Length<float>(&(param_3->shading).dpdv);
    auVar35._4_60_ = extraout_var_00;
    auVar39 = extraout_var_00._4_56_;
    _local_148 = auVar35._0_16_;
    VVar47 = GramSchmidt<float>(pVVar1,(Vector3<float> *)&local_118);
    uVar38 = auVar39._0_8_;
    local_e0.z = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar36._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar36._8_56_ = auVar39;
    local_e0._0_8_ = vmovlps_avx(auVar36._0_16_);
    VVar47 = Normalize<float>((Vector3<float> *)&local_e0);
    auVar27._0_4_ = local_128 * VVar47.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar27._4_4_ = local_128 * VVar47.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar27._8_4_ = local_128 * (float)uVar38;
    auVar27._12_4_ = local_128 * (float)((ulong)uVar38 >> 0x20);
    auVar39 = ZEXT856(auVar27._8_8_);
    uVar38 = vmovlps_avx(auVar27);
    (param_4->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar38;
    (param_4->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar38 >> 0x20);
    (param_4->super_Tuple3<pbrt::Vector3,_float>).z =
         local_128 * VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
    VVar47 = Cross<float>((Vector3<float> *)&local_118,param_4);
    uVar38 = auVar39._0_8_;
    local_e0.z = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar37._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar37._8_56_ = auVar39;
    local_e0._0_8_ = vmovlps_avx(auVar37._0_16_);
    VVar47 = Normalize<float>((Vector3<float> *)&local_e0);
    auVar45._0_4_ = (float)local_148._0_4_ * VVar47.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar45._4_4_ = (float)local_148._0_4_ * VVar47.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar45._8_4_ = (float)local_148._0_4_ * (float)uVar38;
    auVar45._12_4_ = (float)local_148._0_4_ * (float)((ulong)uVar38 >> 0x20);
    fVar21 = (float)local_148._0_4_ * VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
    uVar38 = vmovlps_avx(auVar45);
    *param_5 = uVar38;
  }
  else {
    local_f0 = param_4;
    BumpEvalContext::operator_cast_to_TextureEvalContext(param_3);
    uVar2 = param_3->dudx;
    uVar9 = param_3->dudy;
    auVar23._4_4_ = uVar9;
    auVar23._0_4_ = uVar2;
    auVar23._8_8_ = 0;
    local_f8 = &(param_3->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>;
    auVar16._8_4_ = 0x7fffffff;
    auVar16._0_8_ = 0x7fffffff7fffffff;
    auVar16._12_4_ = 0x7fffffff;
    auVar22 = vandps_avx512vl(auVar23,auVar16);
    auVar22 = vhaddps_avx(auVar22,auVar22);
    fVar21 = auVar22._0_4_ * 0.5;
    uVar38 = vcmpss_avx512f(ZEXT416((uint)fVar21),ZEXT816(0) << 0x40,0);
    bVar15 = (bool)((byte)uVar38 & 1);
    fVar21 = (float)((uint)bVar15 * 0x3a03126f + (uint)!bVar15 * (int)fVar21);
    auVar39 = ZEXT856(0);
    _local_148 = ZEXT416((uint)fVar21);
    VVar47 = Tuple3<pbrt::Vector3,float>::operator*((Tuple3<pbrt::Vector3,float> *)local_f8,fVar21);
    local_118.z = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar28._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar28._8_56_ = auVar39;
    local_118._0_8_ = vmovlps_avx(auVar28._0_16_);
    local_e8 = param_5;
    PVar48 = Point3<float>::operator+(&param_3->p,(Vector3<float> *)&local_118);
    frame.x.super_Tuple3<pbrt::Vector3,_float>.z = PVar48.super_Tuple3<pbrt::Point3,_float>.z;
    auVar29._0_8_ = PVar48.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar29._8_56_ = auVar39;
    frame.x.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar29._0_16_);
    TVar8 = (param_3->uv).super_Tuple2<pbrt::Point2,_float>;
    auVar24._0_4_ = (float)local_148._0_4_ + TVar8.x;
    auVar24._4_4_ = TVar8.y + 0.0;
    auVar24._8_8_ = 0;
    uVar38 = vmovlps_avx(auVar24);
    uStack_8c = (undefined4)uVar38;
    uStack_88 = (undefined4)((ulong)uVar38 >> 0x20);
    local_b8 = *param_1;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.z = frame.x.super_Tuple3<pbrt::Vector3,_float>.z;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.x = frame.x.super_Tuple3<pbrt::Vector3,_float>.x;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.y = frame.x.super_Tuple3<pbrt::Vector3,_float>.y;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = frame.y.super_Tuple3<pbrt::Vector3,_float>.x;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = frame.y.super_Tuple3<pbrt::Vector3,_float>.y;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = frame.y.super_Tuple3<pbrt::Vector3,_float>.z;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = frame.z.super_Tuple3<pbrt::Vector3,_float>.x;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = frame.z.super_Tuple3<pbrt::Vector3,_float>.y;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = frame.z.super_Tuple3<pbrt::Vector3,_float>.z;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uStack_8c;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_88;
    ctx.dudx = (Float)uStack_84;
    ctx.dudy = (Float)uStack_80;
    ctx.dvdx = (Float)uStack_7c;
    ctx.dvdy = (Float)uStack_78;
    ctx.faceIndex = iStack_74;
    local_12c = UniversalTextureEvaluator::operator()(&local_149,(FloatTextureHandle)&local_b8,ctx);
    uVar3 = param_3->dvdx;
    uVar10 = param_3->dvdy;
    auVar40._4_4_ = uVar10;
    auVar40._0_4_ = uVar3;
    auVar40._8_8_ = 0;
    pVVar1 = &(param_3->shading).dpdv;
    auVar17._8_4_ = 0x7fffffff;
    auVar17._0_8_ = 0x7fffffff7fffffff;
    auVar17._12_4_ = 0x7fffffff;
    auVar22 = vandps_avx512vl(auVar40,auVar17);
    auVar22 = vhaddps_avx(auVar22,auVar22);
    fVar21 = auVar22._0_4_ * 0.5;
    uVar38 = vcmpss_avx512f(ZEXT416((uint)fVar21),ZEXT416(0),0);
    bVar15 = (bool)((byte)uVar38 & 1);
    local_128 = (float)((uint)bVar15 * 0x3a03126f + (uint)!bVar15 * (int)fVar21);
    auVar39 = ZEXT856(0);
    uStack_124 = 0;
    uStack_120 = 0;
    uStack_11c = 0;
    VVar47 = Tuple3<pbrt::Vector3,float>::operator*((Tuple3<pbrt::Vector3,float> *)pVVar1,local_128)
    ;
    local_118.z = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar30._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar30._8_56_ = auVar39;
    local_118._0_8_ = vmovlps_avx(auVar30._0_16_);
    PVar48 = Point3<float>::operator+(&param_3->p,(Vector3<float> *)&local_118);
    frame.x.super_Tuple3<pbrt::Vector3,_float>.z = PVar48.super_Tuple3<pbrt::Point3,_float>.z;
    auVar31._0_8_ = PVar48.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar31._8_56_ = auVar39;
    frame.x.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar31._0_16_);
    auVar41._0_12_ = ZEXT812(0);
    auVar41._12_4_ = 0;
    auVar19._4_4_ = uStack_124;
    auVar19._0_4_ = local_128;
    auVar19._8_4_ = uStack_120;
    auVar19._12_4_ = uStack_11c;
    auVar22 = vunpcklps_avx(auVar41,auVar19);
    TVar8 = (param_3->uv).super_Tuple2<pbrt::Point2,_float>;
    auVar25._0_4_ = auVar22._0_4_ + TVar8.x;
    auVar25._4_4_ = auVar22._4_4_ + TVar8.y;
    auVar25._8_4_ = auVar22._8_4_ + 0.0;
    auVar25._12_4_ = auVar22._12_4_ + 0.0;
    uVar38 = vmovlps_avx(auVar25);
    uStack_8c = (undefined4)uVar38;
    uStack_88 = (undefined4)((ulong)uVar38 >> 0x20);
    local_c0 = *param_1;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = frame.x.super_Tuple3<pbrt::Vector3,_float>.z;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = frame.x.super_Tuple3<pbrt::Vector3,_float>.x;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = frame.x.super_Tuple3<pbrt::Vector3,_float>.y;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = frame.y.super_Tuple3<pbrt::Vector3,_float>.x;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = frame.y.super_Tuple3<pbrt::Vector3,_float>.y;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = frame.y.super_Tuple3<pbrt::Vector3,_float>.z;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = frame.z.super_Tuple3<pbrt::Vector3,_float>.x;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = frame.z.super_Tuple3<pbrt::Vector3,_float>.y;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = frame.z.super_Tuple3<pbrt::Vector3,_float>.z;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uStack_8c;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_88;
    ctx_00.dudx = (Float)uStack_84;
    ctx_00.dudy = (Float)uStack_80;
    ctx_00.dvdx = (Float)uStack_7c;
    ctx_00.dvdy = (Float)uStack_78;
    ctx_00.faceIndex = iStack_74;
    local_130 = UniversalTextureEvaluator::operator()
                          (&local_149,(FloatTextureHandle)&local_c0,ctx_00);
    local_c8 = *param_1;
    BumpEvalContext::operator_cast_to_TextureEvalContext(param_3);
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)uStack_68;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = local_70;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)uStack_68 >> 0x20);
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)uStack_60;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)uStack_60 >> 0x20);
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uStack_58;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uStack_58 >> 0x20);
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)uStack_50;
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)((ulong)uStack_50 >> 0x20);
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)uStack_48;
    ctx_01.dudx = (Float)(int)((ulong)uStack_48 >> 0x20);
    ctx_01.dudy = (Float)(int)uStack_40;
    ctx_01.dvdx = (Float)(int)((ulong)uStack_40 >> 0x20);
    ctx_01.dvdy = (Float)(int)uStack_38;
    ctx_01.faceIndex = (int)((ulong)uStack_38 >> 0x20);
    local_108 = UniversalTextureEvaluator::operator()
                          (&local_149,(FloatTextureHandle)&local_c8,ctx_01);
    param_5 = local_e8;
    fVar21 = (local_12c - local_108) / (float)local_148._0_4_;
    uVar4 = (param_3->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar11 = (param_3->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_118.z = fVar21 * (param_3->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    uVar38 = 0;
    auVar42._0_4_ = (float)uVar4 * fVar21;
    auVar42._4_4_ = (float)uVar11 * fVar21;
    auVar42._8_4_ = fVar21 * 0.0;
    auVar42._12_4_ = fVar21 * 0.0;
    local_118._0_8_ = vmovlps_avx(auVar42);
    VVar47 = Tuple3<pbrt::Vector3,float>::operator+(local_f8,(Vector3<float> *)&local_118);
    uVar5 = (param_3->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar12 = (param_3->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    fVar21 = (param_3->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    local_148._4_4_ = local_108;
    local_148._0_4_ = local_108;
    fStack_140 = local_108;
    fStack_13c = local_108;
    auVar26._0_4_ = VVar47.super_Tuple3<pbrt::Vector3,_float>.x + local_108 * (float)uVar5;
    auVar26._4_4_ = VVar47.super_Tuple3<pbrt::Vector3,_float>.y + local_108 * (float)uVar12;
    auVar26._8_4_ = (float)uVar38 + local_108 * 0.0;
    auVar26._12_4_ = (float)((ulong)uVar38 >> 0x20) + local_108 * 0.0;
    uVar38 = vmovlps_avx(auVar26);
    (local_f0->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar38;
    (local_f0->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar38 >> 0x20);
    (local_f0->super_Tuple3<pbrt::Vector3,_float>).z =
         VVar47.super_Tuple3<pbrt::Vector3,_float>.z + local_108 * fVar21;
    uVar6 = (param_3->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar13 = (param_3->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    fVar21 = (local_130 - local_108) / local_128;
    local_118.z = fVar21 * (param_3->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    uVar38 = 0;
    auVar43._0_4_ = fVar21 * (float)uVar6;
    auVar43._4_4_ = fVar21 * (float)uVar13;
    auVar43._8_4_ = fVar21 * 0.0;
    auVar43._12_4_ = fVar21 * 0.0;
    local_118._0_8_ = vmovlps_avx(auVar43);
    VVar47 = Tuple3<pbrt::Vector3,float>::operator+
                       (&pVVar1->super_Tuple3<pbrt::Vector3,_float>,(Vector3<float> *)&local_118);
    uVar7 = (param_3->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar14 = (param_3->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar46._0_4_ =
         VVar47.super_Tuple3<pbrt::Vector3,_float>.x + (float)uVar7 * (float)local_148._0_4_;
    auVar46._4_4_ =
         VVar47.super_Tuple3<pbrt::Vector3,_float>.y + (float)uVar14 * (float)local_148._4_4_;
    auVar46._8_4_ = (float)uVar38 + fStack_140 * 0.0;
    auVar46._12_4_ = (float)((ulong)uVar38 >> 0x20) + fStack_13c * 0.0;
    fVar21 = VVar47.super_Tuple3<pbrt::Vector3,_float>.z +
             local_108 * (param_3->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    uVar38 = vmovlps_avx(auVar46);
    *param_5 = uVar38;
  }
  *(float *)(param_5 + 1) = fVar21;
  return;
}

Assistant:

PBRT_CPU_GPU void Bump(TextureEvaluator texEval, FloatTextureHandle displacement,
                       const Image *normalMap, const BumpEvalContext &ctx, Vector3f *dpdu,
                       Vector3f *dpdv) {
    DCHECK(displacement != nullptr || normalMap != nullptr);
    if (displacement) {
        if (displacement)
            DCHECK(texEval.CanEvaluate({displacement}, {}));
        // Compute offset positions and evaluate displacement texture
        TextureEvalContext shiftedCtx = ctx;
        // Shift _shiftedCtx_ _du_ in the $u$ direction
        Float du = .5f * (std::abs(ctx.dudx) + std::abs(ctx.dudy));
        if (du == 0)
            du = .0005f;
        shiftedCtx.p = ctx.p + du * ctx.shading.dpdu;
        shiftedCtx.uv = ctx.uv + Vector2f(du, 0.f);

        Float uDisplace = texEval(displacement, shiftedCtx);
        // Shift _shiftedCtx_ _dv_ in the $v$ direction
        Float dv = .5f * (std::abs(ctx.dvdx) + std::abs(ctx.dvdy));
        if (dv == 0)
            dv = .0005f;
        shiftedCtx.p = ctx.p + dv * ctx.shading.dpdv;
        shiftedCtx.uv = ctx.uv + Vector2f(0.f, dv);

        Float vDisplace = texEval(displacement, shiftedCtx);
        Float displace = texEval(displacement, ctx);

        // Compute bump-mapped differential geometry
        *dpdu = ctx.shading.dpdu + (uDisplace - displace) / du * Vector3f(ctx.shading.n) +
                displace * Vector3f(ctx.shading.dndu);
        *dpdv = ctx.shading.dpdv + (vDisplace - displace) / dv * Vector3f(ctx.shading.n) +
                displace * Vector3f(ctx.shading.dndv);

    } else {
        // Sample normal map to compute shading normal
        WrapMode2D wrap(WrapMode::Repeat);
        Point2f uv(ctx.uv[0], 1 - ctx.uv[1]);
        Vector3f ns(2 * normalMap->BilerpChannel(uv, 0, wrap) - 1,
                    2 * normalMap->BilerpChannel(uv, 1, wrap) - 1,
                    2 * normalMap->BilerpChannel(uv, 2, wrap) - 1);
        ns = Normalize(ns);
        Frame frame = Frame::FromZ(ctx.shading.n);
        ns = frame.FromLocal(ns);

        Float ulen = Length(ctx.shading.dpdu), vlen = Length(ctx.shading.dpdv);
        *dpdu = Normalize(GramSchmidt(ctx.shading.dpdu, ns)) * ulen;
        *dpdv = Normalize(Cross(ns, *dpdu)) * vlen;
    }
}